

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration_object.c
# Opt level: O0

configuration configuration_object_initialize(char *name,char *path,configuration parent)

{
  configuration hash_cb;
  char *pcVar1;
  size_t sVar2;
  set_cb_compare compare_cb;
  set psVar3;
  configuration in_RDX;
  set_cb_iterate in_RSI;
  set in_RDI;
  size_t path_size;
  size_t name_size;
  configuration config;
  size_t local_38;
  char *in_stack_fffffffffffffff8;
  
  hash_cb = (configuration)malloc(0x30);
  local_38 = 0;
  if (hash_cb == (configuration)0x0) {
    log_write_impl_va("metacall",0x7e,"configuration_object_initialize",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/configuration/source/configuration_object.c"
                      ,LOG_LEVEL_ERROR,"Invalid configuration object allocation");
    hash_cb = (configuration)0x0;
  }
  else {
    if (in_RSI == (set_cb_iterate)0x0) {
      hash_cb->source = (char *)0x0;
    }
    else {
      pcVar1 = configuration_object_read(in_stack_fffffffffffffff8);
      hash_cb->source = pcVar1;
      if (hash_cb->source == (char *)0x0) {
        free(hash_cb);
        return (configuration)0x0;
      }
    }
    sVar2 = strlen((char *)in_RDI);
    compare_cb = (set_cb_compare)(sVar2 + 1);
    pcVar1 = (char *)malloc((size_t)compare_cb);
    hash_cb->name = pcVar1;
    psVar3 = set_create((set_cb_hash)hash_cb,compare_cb);
    hash_cb->map = psVar3;
    if (in_RSI == (set_cb_iterate)0x0) {
      hash_cb->path = (char *)0x0;
    }
    else {
      local_38 = strlen((char *)in_RSI);
      local_38 = local_38 + 1;
      pcVar1 = (char *)malloc(local_38);
      hash_cb->path = pcVar1;
      if (hash_cb->path == (char *)0x0) {
        log_write_impl_va("metacall",0xa1,"configuration_object_initialize",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/configuration/source/configuration_object.c"
                          ,LOG_LEVEL_ERROR,"Invalid configuration object initialization");
        configuration_object_destroy((configuration)0x12d661);
        return (configuration)0x0;
      }
    }
    if ((hash_cb->name == (char *)0x0) || (hash_cb->map == (set)0x0)) {
      log_write_impl_va("metacall",0xaf,"configuration_object_initialize",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/configuration/source/configuration_object.c"
                        ,LOG_LEVEL_ERROR,"Invalid configuration object initialization");
      configuration_object_destroy((configuration)0x12d6cd);
      hash_cb = (configuration)0x0;
    }
    else {
      memcpy(hash_cb->name,in_RDI,(size_t)compare_cb);
      if ((hash_cb->path != (char *)0x0) && (local_38 != 0)) {
        memcpy(hash_cb->path,in_RSI,local_38);
      }
      hash_cb->parent = in_RDX;
      if (hash_cb->parent != (configuration)0x0) {
        set_iterate(in_RDI,in_RSI,in_RDX);
      }
      hash_cb->v = (value)0x0;
    }
  }
  return hash_cb;
}

Assistant:

configuration configuration_object_initialize(const char *name, const char *path, configuration parent)
{
	configuration config = malloc(sizeof(struct configuration_type));

	size_t name_size, path_size = 0;

	if (config == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid configuration object allocation");

		return NULL;
	}

	if (path != NULL)
	{
		config->source = configuration_object_read(path);

		if (config->source == NULL)
		{
			free(config);

			return NULL;
		}
	}
	else
	{
		config->source = NULL;
	}

	name_size = strlen(name) + 1;

	config->name = malloc(name_size * sizeof(char));

	config->map = set_create(&hash_callback_str, &comparable_callback_str);

	if (path != NULL)
	{
		path_size = strlen(path) + 1;

		config->path = malloc(path_size * sizeof(char));

		if (config->path == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid configuration object initialization");

			configuration_object_destroy(config);

			return NULL;
		}
	}
	else
	{
		config->path = NULL;
	}

	if (config->name == NULL || config->map == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid configuration object initialization");

		configuration_object_destroy(config);

		return NULL;
	}

	memcpy(config->name, name, name_size);

	if (config->path && path_size > 0)
	{
		memcpy(config->path, path, path_size);
	}

	config->parent = parent;

	if (config->parent != NULL)
	{
		set_iterate(config->parent->map, &configuration_object_initialize_cb_iterate, config->map);
	}

	config->v = NULL;

	return config;
}